

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Packing_x86::forward(Packing_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Packing *this_00;
  undefined4 *puVar1;
  long lVar2;
  uint uVar3;
  uint _elempack;
  _func_int **pp_Var4;
  void *pvVar5;
  ulong uVar6;
  int remain_1;
  int iVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  int iVar13;
  void *pvVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 *puVar18;
  ulong uVar19;
  void *pvVar20;
  void *pvVar21;
  int iVar22;
  void *pvVar23;
  bool bVar24;
  undefined4 *puVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  int remain;
  int iVar29;
  int iVar30;
  void *pvVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  Mat local_80;
  undefined4 local_38;
  int local_34;
  
  uVar3 = bottom_blob->elempack;
  uVar19 = (ulong)(int)uVar3;
  if (uVar19 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = ((int)bottom_blob->elemsize << 3) / (int)uVar3;
    if (iVar7 == 8) {
      iVar7 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar7;
    }
  }
  this_00 = (Packing *)((long)&this->_vptr_Packing_x86 + (long)this->_vptr_Packing_x86[-3]);
  if ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Packing_x86[-3]) != 0) || (iVar7 != 0x20))
  goto LAB_002861c3;
  _elempack = this_00->out_elempack;
  if (uVar3 == _elempack) goto LAB_00286123;
  uVar15 = _elempack ^ 4 | uVar3 ^ 1;
  bVar32 = uVar15 == 0;
  if (uVar3 == 4) {
    bVar33 = _elempack == 1;
    bVar34 = _elempack == 8;
    bVar35 = false;
LAB_0028617c:
    bVar24 = false;
    local_38 = 0;
  }
  else {
    if (uVar3 == 1) {
      bVar35 = _elempack == 8;
      bVar34 = false;
      bVar33 = false;
      goto LAB_0028617c;
    }
    bVar24 = _elempack == 1 && uVar3 == 8;
    local_38 = CONCAT31((int3)(uVar15 >> 8),_elempack == 4 && uVar3 == 8);
    bVar34 = false;
    bVar35 = false;
    bVar33 = false;
  }
  uVar16 = bottom_blob->elemsize;
  if (((((char)local_38 != '\0') || (bVar34)) || (bVar24)) || ((bVar35 || (bVar32 || bVar33)))) {
    iVar7 = bottom_blob->dims;
    iVar29 = bottom_blob->w;
    uVar15 = bottom_blob->h;
    uVar9 = (ulong)uVar15;
    if (iVar7 == 2) {
      uVar6 = (long)(int)(uVar15 * uVar3) / (long)(int)_elempack;
      if ((int)(uVar15 * uVar3) % (int)_elempack == 0) {
        uVar17 = uVar6 & 0xffffffff;
        iVar7 = (int)uVar6;
        Mat::create(top_blob,iVar29,iVar7,(long)(int)_elempack * (uVar16 / uVar19),_elempack,
                    opt->blob_allocator);
        pvVar5 = top_blob->data;
        if (pvVar5 == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if (bVar32) {
            pvVar14 = bottom_blob->data;
            lVar12 = (long)bottom_blob->w * bottom_blob->elemsize;
            iVar22 = top_blob->w;
            sVar10 = top_blob->elemsize;
            uVar19 = 0;
            iVar8 = 0;
            if (0 < iVar29) {
              iVar8 = iVar29;
            }
            uVar16 = 0;
            if (0 < iVar7) {
              uVar16 = uVar17;
            }
            for (; uVar19 != uVar16; uVar19 = uVar19 + 1) {
              puVar18 = (undefined4 *)((long)pvVar14 + uVar19 * lVar12 * 4);
              puVar25 = (undefined4 *)((long)iVar22 * sVar10 * uVar19 + (long)pvVar5);
              iVar30 = iVar8;
              while (bVar32 = iVar30 != 0, iVar30 = iVar30 + -1, bVar32) {
                *puVar25 = *puVar18;
                puVar25[1] = *(undefined4 *)((long)puVar18 + lVar12);
                puVar25[2] = *(undefined4 *)((long)puVar18 + lVar12 * 2);
                puVar1 = (undefined4 *)((long)puVar18 + lVar12 * 3);
                puVar18 = puVar18 + 1;
                puVar25[3] = *puVar1;
                puVar25 = puVar25 + 4;
              }
            }
          }
          if (bVar33) {
            pvVar14 = bottom_blob->data;
            iVar22 = bottom_blob->w;
            sVar10 = bottom_blob->elemsize;
            lVar12 = (long)top_blob->w * top_blob->elemsize;
            uVar19 = 0;
            iVar8 = 0;
            if (0 < iVar29) {
              iVar8 = iVar29;
            }
            uVar16 = 0;
            if (0 < (int)uVar15) {
              uVar16 = uVar9;
            }
            for (; uVar19 != uVar16; uVar19 = uVar19 + 1) {
              puVar25 = (undefined4 *)((long)iVar22 * sVar10 * uVar19 + (long)pvVar14);
              puVar18 = (undefined4 *)((long)pvVar5 + uVar19 * lVar12 * 4);
              iVar30 = iVar8;
              while (bVar32 = iVar30 != 0, iVar30 = iVar30 + -1, bVar32) {
                *puVar18 = *puVar25;
                *(undefined4 *)((long)puVar18 + lVar12) = puVar25[1];
                *(undefined4 *)((long)puVar18 + lVar12 * 2) = puVar25[2];
                *(undefined4 *)((long)puVar18 + lVar12 * 3) = puVar25[3];
                puVar18 = puVar18 + 1;
                puVar25 = puVar25 + 4;
              }
            }
          }
          if (bVar35) {
            pvVar14 = bottom_blob->data;
            lVar12 = (long)bottom_blob->w * bottom_blob->elemsize;
            uVar16 = 0;
            uVar19 = 0;
            if (0 < iVar7) {
              uVar19 = uVar17;
            }
            iVar22 = top_blob->w;
            lVar2 = lVar12 * 8;
            pvVar21 = (void *)((long)pvVar14 + lVar12);
            pvVar23 = (void *)((long)pvVar14 + lVar12 * 2);
            pvVar26 = (void *)(lVar12 * 3 + (long)pvVar14);
            pvVar31 = (void *)((long)pvVar14 + lVar12 * 4);
            pvVar28 = (void *)(lVar12 * 5 + (long)pvVar14);
            pvVar20 = (void *)(lVar12 * 6 + (long)pvVar14);
            pvVar27 = (void *)(lVar12 * 7 + (long)pvVar14);
            sVar10 = top_blob->elemsize;
            pvVar11 = pvVar5;
            for (; uVar16 != uVar19; uVar16 = uVar16 + 1) {
              lVar12 = 0;
              for (iVar8 = iVar29; 0 < iVar8; iVar8 = iVar8 + -1) {
                *(undefined4 *)((long)pvVar11 + lVar12 * 8) =
                     *(undefined4 *)((long)pvVar14 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 4) =
                     *(undefined4 *)((long)pvVar21 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 8) =
                     *(undefined4 *)((long)pvVar23 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 0xc) =
                     *(undefined4 *)((long)pvVar26 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 0x10) =
                     *(undefined4 *)((long)pvVar31 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 0x14) =
                     *(undefined4 *)((long)pvVar28 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 0x18) =
                     *(undefined4 *)((long)pvVar20 + lVar12);
                *(undefined4 *)((long)pvVar11 + lVar12 * 8 + 0x1c) =
                     *(undefined4 *)((long)pvVar27 + lVar12);
                lVar12 = lVar12 + 4;
              }
              pvVar14 = (void *)((long)pvVar14 + lVar2);
              pvVar21 = (void *)((long)pvVar21 + lVar2);
              pvVar23 = (void *)((long)pvVar23 + lVar2);
              pvVar26 = (void *)((long)pvVar26 + lVar2);
              pvVar31 = (void *)((long)pvVar31 + lVar2);
              pvVar28 = (void *)((long)pvVar28 + lVar2);
              pvVar20 = (void *)((long)pvVar20 + lVar2);
              pvVar27 = (void *)((long)pvVar27 + lVar2);
              pvVar11 = (void *)((long)pvVar11 + (long)iVar22 * sVar10);
            }
          }
          if (bVar24) {
            pvVar14 = bottom_blob->data;
            lVar12 = (long)top_blob->w * top_blob->elemsize;
            uVar16 = 0;
            uVar19 = 0;
            if (0 < (int)uVar15) {
              uVar19 = uVar9;
            }
            iVar22 = bottom_blob->w;
            sVar10 = bottom_blob->elemsize;
            lVar2 = lVar12 * 8;
            pvVar21 = (void *)((long)pvVar5 + lVar12);
            pvVar23 = (void *)((long)pvVar5 + lVar12 * 2);
            pvVar26 = (void *)(lVar12 * 3 + (long)pvVar5);
            pvVar31 = (void *)((long)pvVar5 + lVar12 * 4);
            pvVar28 = (void *)(lVar12 * 5 + (long)pvVar5);
            pvVar20 = (void *)(lVar12 * 6 + (long)pvVar5);
            pvVar27 = (void *)(lVar12 * 7 + (long)pvVar5);
            pvVar11 = pvVar5;
            for (; uVar16 != uVar19; uVar16 = uVar16 + 1) {
              lVar12 = 0;
              for (iVar8 = iVar29; 0 < iVar8; iVar8 = iVar8 + -1) {
                *(undefined4 *)((long)pvVar11 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8);
                *(undefined4 *)((long)pvVar21 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 4);
                *(undefined4 *)((long)pvVar23 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 8);
                *(undefined4 *)((long)pvVar26 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0xc);
                *(undefined4 *)((long)pvVar31 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x10);
                *(undefined4 *)((long)pvVar28 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x14);
                *(undefined4 *)((long)pvVar20 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x18);
                *(undefined4 *)((long)pvVar27 + lVar12) =
                     *(undefined4 *)((long)pvVar14 + lVar12 * 8 + 0x1c);
                lVar12 = lVar12 + 4;
              }
              pvVar14 = (void *)((long)pvVar14 + (long)iVar22 * sVar10);
              pvVar11 = (void *)((long)pvVar11 + lVar2);
              pvVar21 = (void *)((long)pvVar21 + lVar2);
              pvVar23 = (void *)((long)pvVar23 + lVar2);
              pvVar26 = (void *)((long)pvVar26 + lVar2);
              pvVar31 = (void *)((long)pvVar31 + lVar2);
              pvVar28 = (void *)((long)pvVar28 + lVar2);
              pvVar20 = (void *)((long)pvVar20 + lVar2);
              pvVar27 = (void *)((long)pvVar27 + lVar2);
            }
          }
          if (bVar34) {
            lVar12 = (long)bottom_blob->w * bottom_blob->elemsize;
            iVar22 = top_blob->w;
            sVar10 = top_blob->elemsize;
            uVar19 = 0;
            iVar8 = 0;
            if (0 < iVar29) {
              iVar8 = iVar29;
            }
            pvVar14 = bottom_blob->data;
            if (iVar7 < 1) {
              uVar17 = uVar19;
            }
            for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
              puVar18 = (undefined4 *)((long)pvVar14 + uVar19 * lVar12 * 2);
              puVar25 = (undefined4 *)((long)iVar22 * sVar10 * uVar19 + (long)pvVar5);
              iVar7 = iVar8;
              while (bVar32 = iVar7 != 0, iVar7 = iVar7 + -1, bVar32) {
                *puVar25 = *puVar18;
                puVar25[1] = puVar18[1];
                puVar25[2] = puVar18[2];
                puVar25[3] = puVar18[3];
                puVar25[4] = *(undefined4 *)((long)puVar18 + lVar12);
                puVar25[5] = *(undefined4 *)((long)puVar18 + lVar12 + 4);
                puVar25[6] = *(undefined4 *)((long)puVar18 + lVar12 + 8);
                puVar25[7] = *(undefined4 *)((long)puVar18 + lVar12 + 0xc);
                puVar18 = puVar18 + 4;
                puVar25 = puVar25 + 8;
              }
            }
          }
          if ((char)local_38 == '\0') {
            return 0;
          }
          iVar7 = bottom_blob->w;
          sVar10 = bottom_blob->elemsize;
          pvVar14 = bottom_blob->data;
          lVar12 = (long)top_blob->w * top_blob->elemsize;
          if (iVar29 < 1) {
            iVar29 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar9 = 0;
          }
          for (uVar19 = 0; uVar19 != uVar9; uVar19 = uVar19 + 1) {
            puVar25 = (undefined4 *)((long)iVar7 * sVar10 * uVar19 + (long)pvVar14);
            puVar18 = (undefined4 *)((long)pvVar5 + uVar19 * lVar12 * 2);
            iVar22 = iVar29;
            while (bVar32 = iVar22 != 0, iVar22 = iVar22 + -1, bVar32) {
              *puVar18 = *puVar25;
              puVar18[1] = puVar25[1];
              puVar18[2] = puVar25[2];
              puVar18[3] = puVar25[3];
              *(undefined4 *)((long)puVar18 + lVar12) = puVar25[4];
              *(undefined4 *)((long)puVar18 + lVar12 + 4) = puVar25[5];
              *(undefined4 *)((long)puVar18 + lVar12 + 8) = puVar25[6];
              *(undefined4 *)((long)puVar18 + lVar12 + 0xc) = puVar25[7];
              puVar25 = puVar25 + 8;
              puVar18 = puVar18 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      if (iVar7 == 1) {
        iVar29 = iVar29 * uVar3;
        Mat::operator=(top_blob,bottom_blob);
        if (iVar29 % (int)_elempack != 0) {
          return 0;
        }
        pp_Var4 = this->_vptr_Packing_x86;
        top_blob->w = iVar29 / *(int *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        top_blob->cstep = (long)(iVar29 / *(int *)(&this->field_0xd0 + (long)pp_Var4[-3]));
        top_blob->elemsize =
             (long)*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) * (uVar16 / uVar19);
        top_blob->elempack = *(int *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        return 0;
      }
      if (1 < iVar7 - 3U) {
        return 0;
      }
      iVar22 = bottom_blob->c;
      if ((int)(uVar3 * iVar22) % (int)_elempack == 0) {
        iVar8 = bottom_blob->d;
        iVar30 = (int)(uVar3 * iVar22) / (int)_elempack;
        sVar10 = (uVar16 / uVar19) * (long)(int)_elempack;
        if (iVar7 == 3) {
          Mat::create(top_blob,iVar29,uVar15,iVar30,sVar10,_elempack,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,iVar29,uVar15,iVar8,iVar30,sVar10,_elempack,opt->blob_allocator);
        }
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        iVar8 = uVar15 * iVar29 * iVar8;
        if (bVar32) {
          iVar29 = 0;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          iVar13 = 0;
          if (0 < iVar30) {
            iVar13 = iVar30;
          }
          for (; iVar29 != iVar13; iVar29 = iVar29 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar29 * 4);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar29 * 4 + 1);
            pvVar14 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar29 * 4 + 2);
            pvVar21 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar29 * 4 + 3);
            pvVar23 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29);
            puVar18 = (undefined4 *)local_80.data;
            Mat::~Mat(&local_80);
            for (lVar12 = 0; iVar7 != (int)lVar12; lVar12 = lVar12 + 1) {
              *puVar18 = *(undefined4 *)((long)pvVar5 + lVar12 * 4);
              puVar18[1] = *(undefined4 *)((long)pvVar14 + lVar12 * 4);
              puVar18[2] = *(undefined4 *)((long)pvVar21 + lVar12 * 4);
              puVar18[3] = *(undefined4 *)((long)pvVar23 + lVar12 * 4);
              puVar18 = puVar18 + 4;
            }
          }
        }
        if (bVar33) {
          iVar29 = 0;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          iVar13 = 0;
          if (0 < iVar22) {
            iVar13 = iVar22;
          }
          for (; iVar29 != iVar13; iVar29 = iVar29 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar29);
            puVar18 = (undefined4 *)local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 4);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 4 + 1);
            pvVar14 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 4 + 2);
            pvVar21 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 4 + 3);
            pvVar23 = local_80.data;
            Mat::~Mat(&local_80);
            for (lVar12 = 0; iVar7 != (int)lVar12; lVar12 = lVar12 + 1) {
              *(undefined4 *)((long)pvVar5 + lVar12 * 4) = *puVar18;
              *(undefined4 *)((long)pvVar14 + lVar12 * 4) = puVar18[1];
              *(undefined4 *)((long)pvVar21 + lVar12 * 4) = puVar18[2];
              *(undefined4 *)((long)pvVar23 + lVar12 * 4) = puVar18[3];
              puVar18 = puVar18 + 4;
            }
          }
        }
        if (bVar35) {
          iVar7 = 0;
          local_34 = 0;
          if (0 < iVar30) {
            local_34 = iVar30;
          }
          for (; iVar7 != local_34; iVar7 = iVar7 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar7 * 8);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 1);
            pvVar14 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 2);
            pvVar21 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 3);
            pvVar23 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 4);
            pvVar31 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 5);
            pvVar11 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 6);
            pvVar20 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar7 * 8 + 7);
            pvVar26 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar7);
            pvVar27 = local_80.data;
            Mat::~Mat(&local_80);
            lVar12 = 0;
            for (iVar29 = iVar8; 0 < iVar29; iVar29 = iVar29 + -1) {
              *(undefined4 *)((long)pvVar27 + lVar12 * 2 * 4) =
                   *(undefined4 *)((long)pvVar5 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 1) * 4) =
                   *(undefined4 *)((long)pvVar14 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 2) * 4) =
                   *(undefined4 *)((long)pvVar21 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 3) * 4) =
                   *(undefined4 *)((long)pvVar23 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 4) * 4) =
                   *(undefined4 *)((long)pvVar31 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 5) * 4) =
                   *(undefined4 *)((long)pvVar11 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 6) * 4) =
                   *(undefined4 *)((long)pvVar20 + lVar12);
              *(undefined4 *)((long)pvVar27 + (lVar12 * 2 + 7) * 4) =
                   *(undefined4 *)((long)pvVar26 + lVar12);
              lVar12 = lVar12 + 4;
            }
          }
        }
        if (bVar24) {
          iVar29 = 0;
          iVar7 = 0;
          if (0 < iVar22) {
            iVar7 = iVar22;
          }
          for (; iVar29 != iVar7; iVar29 = iVar29 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar29);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8);
            pvVar14 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 1);
            pvVar21 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 2);
            pvVar23 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 3);
            pvVar31 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 4);
            pvVar11 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 5);
            pvVar20 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 6);
            pvVar26 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29 * 8 + 7);
            pvVar27 = local_80.data;
            Mat::~Mat(&local_80);
            lVar12 = 0;
            for (iVar13 = iVar8; 0 < iVar13; iVar13 = iVar13 + -1) {
              *(undefined4 *)((long)pvVar14 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + lVar12 * 2 * 4);
              *(undefined4 *)((long)pvVar21 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 1) * 4);
              *(undefined4 *)((long)pvVar23 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 2) * 4);
              *(undefined4 *)((long)pvVar31 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 3) * 4);
              *(undefined4 *)((long)pvVar11 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 4) * 4);
              *(undefined4 *)((long)pvVar20 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 5) * 4);
              *(undefined4 *)((long)pvVar26 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 6) * 4);
              *(undefined4 *)((long)pvVar27 + lVar12) =
                   *(undefined4 *)((long)pvVar5 + (lVar12 * 2 + 7) * 4);
              lVar12 = lVar12 + 4;
            }
          }
        }
        if (bVar34) {
          iVar29 = 0;
          iVar7 = 0;
          if (0 < iVar8) {
            iVar7 = iVar8;
          }
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          for (; iVar29 != iVar30; iVar29 = iVar29 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar29 * 2);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,bottom_blob,iVar29 * 2 + 1);
            pvVar14 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar29);
            pvVar21 = local_80.data;
            Mat::~Mat(&local_80);
            lVar12 = 0;
            iVar13 = iVar7;
            while (bVar32 = iVar13 != 0, iVar13 = iVar13 + -1, bVar32) {
              *(undefined4 *)((long)pvVar21 + lVar12 * 2) = *(undefined4 *)((long)pvVar5 + lVar12);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 4) =
                   *(undefined4 *)((long)pvVar5 + lVar12 + 4);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 8) =
                   *(undefined4 *)((long)pvVar5 + lVar12 + 8);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 0xc) =
                   *(undefined4 *)((long)pvVar5 + lVar12 + 0xc);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 0x10) =
                   *(undefined4 *)((long)pvVar14 + lVar12);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 0x14) =
                   *(undefined4 *)((long)pvVar14 + lVar12 + 4);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 0x18) =
                   *(undefined4 *)((long)pvVar14 + lVar12 + 8);
              *(undefined4 *)((long)pvVar21 + lVar12 * 2 + 0x1c) =
                   *(undefined4 *)((long)pvVar14 + lVar12 + 0xc);
              lVar12 = lVar12 + 0x10;
            }
          }
        }
        if ((char)local_38 == '\0') {
          return 0;
        }
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        for (iVar7 = 0; iVar7 != iVar22; iVar7 = iVar7 + 1) {
          Mat::channel(&local_80,bottom_blob,iVar7);
          pvVar5 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,top_blob,iVar7 * 2);
          pvVar14 = local_80.data;
          Mat::~Mat(&local_80);
          Mat::channel(&local_80,top_blob,iVar7 * 2 + 1);
          pvVar21 = local_80.data;
          Mat::~Mat(&local_80);
          lVar12 = 0;
          iVar29 = iVar8;
          while (bVar32 = iVar29 != 0, iVar29 = iVar29 + -1, bVar32) {
            *(undefined4 *)((long)pvVar14 + lVar12) = *(undefined4 *)((long)pvVar5 + lVar12 * 2);
            *(undefined4 *)((long)pvVar14 + lVar12 + 4) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 4);
            *(undefined4 *)((long)pvVar14 + lVar12 + 8) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 8);
            *(undefined4 *)((long)pvVar14 + lVar12 + 0xc) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 0xc);
            *(undefined4 *)((long)pvVar21 + lVar12) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 0x10);
            *(undefined4 *)((long)pvVar21 + lVar12 + 4) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 0x14);
            *(undefined4 *)((long)pvVar21 + lVar12 + 8) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 0x18);
            *(undefined4 *)((long)pvVar21 + lVar12 + 0xc) =
                 *(undefined4 *)((long)pvVar5 + lVar12 * 2 + 0x1c);
            lVar12 = lVar12 + 0x10;
          }
        }
        return 0;
      }
    }
LAB_00286123:
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
LAB_002861c3:
  iVar7 = Packing::forward(this_00,bottom_blob,top_blob,opt);
  return iVar7;
}

Assistant:

int Packing_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    if (elembits != 32)
    {
        // non-fp32 type
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to4 = elempack == 1 && out_elempack == 4;
    bool pack4to1 = elempack == 4 && out_elempack == 1;
    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;
    bool pack4to8 = elempack == 4 && out_elempack == 8;
    bool pack8to4 = elempack == 8 && out_elempack == 4;

    if (!pack1to4 && !pack4to1 && !pack1to8 && !pack8to1 && !pack4to8 && !pack8to4)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 4);
                const float* r1 = bottom_blob.row(i * 4 + 1);
                const float* r2 = bottom_blob.row(i * 4 + 2);
                const float* r3 = bottom_blob.row(i * 4 + 3);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 4);
                float* outptr1 = top_blob.row(i * 4 + 1);
                float* outptr2 = top_blob.row(i * 4 + 2);
                float* outptr3 = top_blob.row(i * 4 + 3);

                for (int j = 0; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 8);
                const float* r1 = bottom_blob.row(i * 8 + 1);
                const float* r2 = bottom_blob.row(i * 8 + 2);
                const float* r3 = bottom_blob.row(i * 8 + 3);
                const float* r4 = bottom_blob.row(i * 8 + 4);
                const float* r5 = bottom_blob.row(i * 8 + 5);
                const float* r6 = bottom_blob.row(i * 8 + 6);
                const float* r7 = bottom_blob.row(i * 8 + 7);

                float* outptr = top_blob.row(i);

#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#else
                int remain = w;
#endif

                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 8);
                float* outptr1 = top_blob.row(i * 8 + 1);
                float* outptr2 = top_blob.row(i * 8 + 2);
                float* outptr3 = top_blob.row(i * 8 + 3);
                float* outptr4 = top_blob.row(i * 8 + 4);
                float* outptr5 = top_blob.row(i * 8 + 5);
                float* outptr6 = top_blob.row(i * 8 + 6);
                float* outptr7 = top_blob.row(i * 8 + 7);
#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
#else
                int remain = w;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif
                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 2);
                const float* r1 = bottom_blob.row(i * 2 + 1);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 2);
                float* outptr1 = top_blob.row(i * 2 + 1);

                for (int j = 0; j < w; j++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 4);
                const float* r1 = bottom_blob.channel(q * 4 + 1);
                const float* r2 = bottom_blob.channel(q * 4 + 2);
                const float* r3 = bottom_blob.channel(q * 4 + 3);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 8);
                const float* r1 = bottom_blob.channel(q * 8 + 1);
                const float* r2 = bottom_blob.channel(q * 8 + 2);
                const float* r3 = bottom_blob.channel(q * 8 + 3);
                const float* r4 = bottom_blob.channel(q * 8 + 4);
                const float* r5 = bottom_blob.channel(q * 8 + 5);
                const float* r6 = bottom_blob.channel(q * 8 + 6);
                const float* r7 = bottom_blob.channel(q * 8 + 7);

                float* outptr = top_blob.channel(q);

#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#endif
                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 8);
                float* outptr1 = top_blob.channel(q * 8 + 1);
                float* outptr2 = top_blob.channel(q * 8 + 2);
                float* outptr3 = top_blob.channel(q * 8 + 3);
                float* outptr4 = top_blob.channel(q * 8 + 4);
                float* outptr5 = top_blob.channel(q * 8 + 5);
                float* outptr6 = top_blob.channel(q * 8 + 6);
                float* outptr7 = top_blob.channel(q * 8 + 7);
#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif

                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 2);
                const float* r1 = bottom_blob.channel(q * 2 + 1);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    return 0;
}